

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

int __thiscall CServer::SendMsg(CServer *this,CMsgPacker *pMsg,int Flags,int ClientID)

{
  int iVar1;
  long lVar2;
  CClient *pCVar3;
  long in_FS_OFFSET;
  CNetChunk Packet;
  CNetChunk local_60;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (pMsg == (CMsgPacker *)0x0) {
    iVar1 = -1;
  }
  else {
    if (ClientID != -1) {
      iVar1 = 0;
      if (((0x3f < (uint)ClientID) || (iVar1 = 0, this->m_aClients[(uint)ClientID].m_State == 0)) ||
         (this->m_aClients[(uint)ClientID].m_Quitting != false)) goto LAB_00111eef;
    }
    mem_zero(&local_60,0x30);
    local_60.m_DataSize = *(int *)&(pMsg->super_CPacker).m_pCurrent - (int)pMsg;
    if ((Flags & 1U) != 0) {
      local_60.m_Flags._0_1_ = (byte)local_60.m_Flags | 1;
    }
    if ((Flags & 2U) != 0) {
      local_60.m_Flags._0_1_ = (byte)local_60.m_Flags | 4;
    }
    local_60.m_ClientID = ClientID;
    local_60.m_pData = pMsg;
    if ((Flags & 4U) == 0) {
      CDemoRecorder::RecordMessage(&this->m_DemoRecorder,pMsg,local_60.m_DataSize);
    }
    iVar1 = 0;
    if ((Flags & 0x10U) == 0) {
      if (ClientID == -1) {
        pCVar3 = this->m_aClients;
        lVar2 = 0;
        do {
          if ((pCVar3->m_State == 5) && (pCVar3->m_Quitting == false)) {
            local_60.m_ClientID = (int)lVar2;
            CNetServer::Send(&this->m_NetServer,&local_60,0xffffffff);
          }
          lVar2 = lVar2 + 1;
          pCVar3 = pCVar3 + 1;
        } while (lVar2 != 0x40);
        iVar1 = 0;
      }
      else {
        CNetServer::Send(&this->m_NetServer,&local_60,0xffffffff);
      }
    }
  }
LAB_00111eef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int CServer::SendMsg(CMsgPacker *pMsg, int Flags, int ClientID)
{
	CNetChunk Packet;
	if(!pMsg)
		return -1;

	// drop invalid packet
	if(ClientID != -1 && (ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CClient::STATE_EMPTY || m_aClients[ClientID].m_Quitting))
		return 0;

	mem_zero(&Packet, sizeof(CNetChunk));
	Packet.m_ClientID = ClientID;
	Packet.m_pData = pMsg->Data();
	Packet.m_DataSize = pMsg->Size();

	if(Flags&MSGFLAG_VITAL)
		Packet.m_Flags |= NETSENDFLAG_VITAL;
	if(Flags&MSGFLAG_FLUSH)
		Packet.m_Flags |= NETSENDFLAG_FLUSH;

	// write message to demo recorder
	if(!(Flags&MSGFLAG_NORECORD))
		m_DemoRecorder.RecordMessage(pMsg->Data(), pMsg->Size());

	if(!(Flags&MSGFLAG_NOSEND))
	{
		if(ClientID == -1)
		{
			// broadcast
			int i;
			for(i = 0; i < MAX_CLIENTS; i++)
				if(m_aClients[i].m_State == CClient::STATE_INGAME && !m_aClients[i].m_Quitting)
				{
					Packet.m_ClientID = i;
					m_NetServer.Send(&Packet);
				}
		}
		else
			m_NetServer.Send(&Packet);
	}
	return 0;
}